

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

int __thiscall nuraft::asio_rpc_listener::listen(asio_rpc_listener *this,int __fd,int __n)

{
  int iVar1;
  undefined4 in_register_00000034;
  lock_guard<std::mutex> guard;
  lock_guard<std::mutex> local_18;
  
  local_18._M_device = &this->listener_lock_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)local_18._M_device);
  if (iVar1 == 0) {
    (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)CONCAT44(in_register_00000034,__fd);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((undefined8 *)CONCAT44(in_register_00000034,__fd) + 1));
    this->stopped_ = false;
    start(this,&local_18);
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)local_18._M_device);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

virtual void listen(ptr<msg_handler>& handler) override {
        std::lock_guard<std::mutex> guard(listener_lock_);
        handler_ = handler;
        stopped_ = false;
        start(guard);
    }